

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O3

void __thiscall
singleParticleSpectra::output_three_particle_correlation(singleParticleSpectra *this)

{
  char *pcVar1;
  size_type sVar2;
  ostream *poVar3;
  undefined8 uVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  ofstream output_os;
  ofstream output_ss;
  ofstream output;
  ostringstream filename_os;
  ostringstream filename_ss;
  ostringstream filename;
  double local_ae8;
  double local_ae0;
  double local_ad8;
  char *local_ab8;
  char local_aa8 [16];
  char *local_a98;
  filebuf local_a90 [8];
  char local_a88 [8];
  uint auStack_a80 [56];
  ios_base aiStack_9a0 [264];
  char *local_898;
  filebuf local_890 [8];
  char local_888 [8];
  uint auStack_880 [56];
  ios_base aiStack_7a0 [264];
  char *local_698;
  filebuf local_690 [8];
  undefined8 uStack_688;
  uint auStack_680 [56];
  ios_base local_5a0 [264];
  ostringstream local_498 [112];
  ios_base local_428 [264];
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  sVar2 = (this->path_)._M_string_length;
  if (this->rap_type == 0) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar1,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"/particle_",10);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->particle_monval);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_Cmnk",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_eta_",5);
    poVar3 = std::ostream::_M_insert<double>(this->rap_min);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_",1);
  }
  else {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar1,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"/particle_",10);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->particle_monval);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_Cmnk",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_y_",3);
    poVar3 = std::ostream::_M_insert<double>(this->rap_min);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_",1);
  }
  poVar3 = std::ostream::_M_insert<double>(this->rap_max);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,".dat",4);
  std::__cxx11::stringbuf::str();
  std::ofstream::ofstream(&local_698,local_898,_S_out);
  if (local_898 != local_888) {
    operator_delete(local_898);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_698,"# n  C_nmk  C_nmk_err",0x15);
  std::ios::widen((char)(ostream *)&local_698 + (char)*(undefined8 *)(local_698 + -0x18));
  std::ostream::put((char)&local_698);
  std::ostream::flush();
  dVar8 = (double)this->total_number_of_events;
  dVar9 = *(this->C_nmk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start / dVar8;
  dVar6 = *(this->C_nmk_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start / dVar8 - dVar9 * dVar9;
  local_ae8 = 0.0;
  if (0.0 < dVar6) {
    dVar6 = dVar6 / dVar8;
    if (dVar6 < 0.0) {
      local_ae8 = sqrt(dVar6);
    }
    else {
      local_ae8 = SQRT(dVar6);
    }
  }
  *(uint *)((long)auStack_680 + *(long *)(local_698 + -0x18)) =
       *(uint *)((long)auStack_680 + *(long *)(local_698 + -0x18)) & 0xfffffefb | 0x100;
  *(undefined8 *)((long)&uStack_688 + *(long *)(local_698 + -0x18)) = 0x12;
  *(undefined8 *)(local_690 + *(long *)(local_698 + -0x18)) = 8;
  poVar3 = (ostream *)std::ostream::operator<<(&local_698,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
  poVar3 = std::ostream::_M_insert<double>(dVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
  poVar3 = std::ostream::_M_insert<double>(local_ae8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (1 < this->num_corr) {
    lVar5 = 1;
    do {
      dVar8 = (double)this->total_number_of_events;
      dVar10 = (this->C_nmk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar5] / dVar8;
      dVar6 = (this->C_nmk_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar5] / dVar8 - dVar10 * dVar10;
      local_ae8 = 0.0;
      if (0.0 < dVar6) {
        dVar6 = dVar6 / dVar8;
        if (dVar6 < 0.0) {
          dVar6 = sqrt(dVar6);
        }
        else {
          dVar6 = SQRT(dVar6);
        }
        local_ae8 = dVar6 / dVar9;
      }
      *(uint *)((long)auStack_680 + *(long *)(local_698 + -0x18)) =
           *(uint *)((long)auStack_680 + *(long *)(local_698 + -0x18)) & 0xfffffefb | 0x100;
      *(undefined8 *)((long)&uStack_688 + *(long *)(local_698 + -0x18)) = 0x12;
      *(undefined8 *)(local_690 + *(long *)(local_698 + -0x18)) = 8;
      poVar3 = (ostream *)std::ostream::operator<<(&local_698,(int)lVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
      poVar3 = std::ostream::_M_insert<double>(dVar10 / dVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
      poVar3 = std::ostream::_M_insert<double>(local_ae8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      lVar5 = lVar5 + 1;
    } while (lVar5 < this->num_corr);
  }
  uVar4 = _log;
  local_698 = _VTT;
  if (this->flag_charge_dependence == 1) {
    std::__cxx11::ostringstream::ostringstream(local_320);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    sVar2 = (this->path_)._M_string_length;
    if (this->rap_type == 0) {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar1,sVar2)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"/particle_",10);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->particle_monval);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_Cmnk_ss_eta_",0xd);
      poVar3 = std::ostream::_M_insert<double>(this->rap_min);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_",1);
    }
    else {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar1,sVar2)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"/particle_",10);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->particle_monval);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_Cmnk_ss_y_",0xb);
      poVar3 = std::ostream::_M_insert<double>(this->rap_min);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_",1);
    }
    poVar3 = std::ostream::_M_insert<double>(this->rap_max);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,".dat",4);
    std::__cxx11::stringbuf::str();
    std::ofstream::ofstream(&local_898,local_a98,_S_out);
    if (local_a98 != local_a88) {
      operator_delete(local_a98);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_898,"# n  C_nmk_ss  C_nmk_ss_err  C_nmk_ss_13  C_nmk_ss_13_err",
               0x39);
    std::ios::widen((char)(ostream *)&local_898 + (char)*(undefined8 *)(local_898 + -0x18));
    std::ostream::put((char)&local_898);
    std::ostream::flush();
    dVar6 = (double)this->total_number_of_events;
    dVar8 = *(this->C_nmk_ss).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start / dVar6;
    local_ae0 = *(this->C_nmk_ss_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start / dVar6 - dVar8 * dVar8;
    local_ae8 = 0.0;
    if (local_ae0 <= 0.0) {
      local_ae0 = 0.0;
    }
    else {
      local_ae0 = local_ae0 / dVar6;
      if (local_ae0 < 0.0) {
        local_ae0 = sqrt(local_ae0);
      }
      else {
        local_ae0 = SQRT(local_ae0);
      }
      dVar6 = (double)this->total_number_of_events;
    }
    dVar10 = *(this->C_nmk_ss_13).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start / dVar6;
    dVar9 = *(this->C_nmk_ss_13_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start / dVar6 - dVar10 * dVar10;
    if (0.0 < dVar9) {
      dVar9 = dVar9 / dVar6;
      if (dVar9 < 0.0) {
        local_ae8 = sqrt(dVar9);
      }
      else {
        local_ae8 = SQRT(dVar9);
      }
    }
    *(uint *)((long)auStack_880 + *(long *)(local_898 + -0x18)) =
         *(uint *)((long)auStack_880 + *(long *)(local_898 + -0x18)) & 0xfffffefb | 0x100;
    pcVar1 = local_888 + *(long *)(local_898 + -0x18);
    pcVar1[0] = '\x12';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
    *(undefined8 *)(local_890 + *(long *)(local_898 + -0x18)) = 8;
    poVar3 = (ostream *)std::ostream::operator<<(&local_898,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
    poVar3 = std::ostream::_M_insert<double>(dVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
    poVar3 = std::ostream::_M_insert<double>(local_ae0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
    poVar3 = std::ostream::_M_insert<double>(dVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
    poVar3 = std::ostream::_M_insert<double>(local_ae8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if (1 < this->num_corr) {
      lVar5 = 1;
      do {
        dVar6 = (double)this->total_number_of_events;
        dVar9 = (this->C_nmk_ss).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar5] / dVar6;
        local_ad8 = (this->C_nmk_ss_err).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start[lVar5] / dVar6 - dVar9 * dVar9;
        if (local_ad8 <= 0.0) {
          local_ad8 = 0.0;
        }
        else {
          local_ad8 = local_ad8 / dVar6;
          if (local_ad8 < 0.0) {
            local_ad8 = sqrt(local_ad8);
          }
          else {
            local_ad8 = SQRT(local_ad8);
          }
          local_ad8 = local_ad8 / dVar8;
          dVar6 = (double)this->total_number_of_events;
        }
        dVar11 = (this->C_nmk_ss_13).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar5] / dVar6;
        dVar7 = (this->C_nmk_ss_13_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar5] / dVar6 - dVar11 * dVar11;
        local_ae8 = 0.0;
        if (0.0 < dVar7) {
          dVar7 = dVar7 / dVar6;
          if (dVar7 < 0.0) {
            dVar7 = sqrt(dVar7);
          }
          else {
            dVar7 = SQRT(dVar7);
          }
          local_ae8 = dVar7 / dVar10;
        }
        *(uint *)((long)auStack_880 + *(long *)(local_898 + -0x18)) =
             *(uint *)((long)auStack_880 + *(long *)(local_898 + -0x18)) & 0xfffffefb | 0x100;
        pcVar1 = local_888 + *(long *)(local_898 + -0x18);
        pcVar1[0] = '\x12';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        *(undefined8 *)(local_890 + *(long *)(local_898 + -0x18)) = 8;
        poVar3 = (ostream *)std::ostream::operator<<(&local_898,(int)lVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
        poVar3 = std::ostream::_M_insert<double>(dVar9 / dVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
        poVar3 = std::ostream::_M_insert<double>(local_ad8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
        poVar3 = std::ostream::_M_insert<double>(dVar11 / dVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
        poVar3 = std::ostream::_M_insert<double>(local_ae8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        lVar5 = lVar5 + 1;
      } while (lVar5 < this->num_corr);
    }
    std::__cxx11::ostringstream::ostringstream(local_498);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    sVar2 = (this->path_)._M_string_length;
    if (this->rap_type == 0) {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,pcVar1,sVar2)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"/particle_",10);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->particle_monval);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_Cmnk_os_eta_",0xd);
      poVar3 = std::ostream::_M_insert<double>(this->rap_min);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_",1);
    }
    else {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,pcVar1,sVar2)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"/particle_",10);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->particle_monval);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_Cmnk_os_y_",0xb);
      poVar3 = std::ostream::_M_insert<double>(this->rap_min);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_",1);
    }
    poVar3 = std::ostream::_M_insert<double>(this->rap_max);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,".dat",4);
    std::__cxx11::stringbuf::str();
    std::ofstream::ofstream(&local_a98,local_ab8,_S_out);
    if (local_ab8 != local_aa8) {
      operator_delete(local_ab8);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_a98,"# n  C_nmk_os  C_nmk_os_err  C_nmk_os_13  C_nmk_os_13_err",
               0x39);
    std::ios::widen((char)(ostream *)&local_a98 + (char)*(undefined8 *)(local_a98 + -0x18));
    std::ostream::put((char)&local_a98);
    std::ostream::flush();
    dVar6 = (double)this->total_number_of_events;
    dVar8 = *(this->C_nmk_os).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start / dVar6;
    local_ae0 = *(this->C_nmk_os_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start / dVar6 - dVar8 * dVar8;
    local_ae8 = 0.0;
    if (local_ae0 <= 0.0) {
      local_ae0 = 0.0;
    }
    else {
      local_ae0 = local_ae0 / dVar6;
      if (local_ae0 < 0.0) {
        local_ae0 = sqrt(local_ae0);
      }
      else {
        local_ae0 = SQRT(local_ae0);
      }
      dVar6 = (double)this->total_number_of_events;
    }
    dVar10 = *(this->C_nmk_os_13).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start / dVar6;
    dVar9 = *(this->C_nmk_os_13_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start / dVar6 - dVar10 * dVar10;
    if (0.0 < dVar9) {
      dVar9 = dVar9 / dVar6;
      if (dVar9 < 0.0) {
        local_ae8 = sqrt(dVar9);
      }
      else {
        local_ae8 = SQRT(dVar9);
      }
    }
    *(uint *)((long)auStack_a80 + *(long *)(local_a98 + -0x18)) =
         *(uint *)((long)auStack_a80 + *(long *)(local_a98 + -0x18)) & 0xfffffefb | 0x100;
    pcVar1 = local_a88 + *(long *)(local_a98 + -0x18);
    pcVar1[0] = '\x12';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
    *(undefined8 *)(local_a90 + *(long *)(local_a98 + -0x18)) = 8;
    poVar3 = (ostream *)std::ostream::operator<<(&local_a98,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
    poVar3 = std::ostream::_M_insert<double>(dVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
    poVar3 = std::ostream::_M_insert<double>(local_ae0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
    poVar3 = std::ostream::_M_insert<double>(dVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
    poVar3 = std::ostream::_M_insert<double>(local_ae8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if (1 < this->num_corr) {
      lVar5 = 1;
      do {
        dVar6 = (double)this->total_number_of_events;
        dVar9 = (this->C_nmk_os).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar5] / dVar6;
        local_ad8 = (this->C_nmk_os_err).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start[lVar5] / dVar6 - dVar9 * dVar9;
        if (local_ad8 <= 0.0) {
          local_ad8 = 0.0;
        }
        else {
          local_ad8 = local_ad8 / dVar6;
          if (local_ad8 < 0.0) {
            local_ad8 = sqrt(local_ad8);
          }
          else {
            local_ad8 = SQRT(local_ad8);
          }
          local_ad8 = local_ad8 / dVar8;
          dVar6 = (double)this->total_number_of_events;
        }
        dVar11 = (this->C_nmk_os_13).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar5] / dVar6;
        dVar7 = (this->C_nmk_os_13_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar5] / dVar6 - dVar11 * dVar11;
        local_ae8 = 0.0;
        if (0.0 < dVar7) {
          dVar7 = dVar7 / dVar6;
          if (dVar7 < 0.0) {
            dVar7 = sqrt(dVar7);
          }
          else {
            dVar7 = SQRT(dVar7);
          }
          local_ae8 = dVar7 / dVar10;
        }
        *(uint *)((long)auStack_a80 + *(long *)(local_a98 + -0x18)) =
             *(uint *)((long)auStack_a80 + *(long *)(local_a98 + -0x18)) & 0xfffffefb | 0x100;
        pcVar1 = local_a88 + *(long *)(local_a98 + -0x18);
        pcVar1[0] = '\x12';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        *(undefined8 *)(local_a90 + *(long *)(local_a98 + -0x18)) = 8;
        poVar3 = (ostream *)std::ostream::operator<<(&local_a98,(int)lVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
        poVar3 = std::ostream::_M_insert<double>(dVar9 / dVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
        poVar3 = std::ostream::_M_insert<double>(local_ad8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
        poVar3 = std::ostream::_M_insert<double>(dVar11 / dVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
        poVar3 = std::ostream::_M_insert<double>(local_ae8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        lVar5 = lVar5 + 1;
      } while (lVar5 < this->num_corr);
    }
    uVar4 = _log;
    pcVar1 = _VTT;
    local_a98 = _VTT;
    *(undefined8 *)(local_a90 + *(long *)(_VTT + -0x18) + -8) = _log;
    std::filebuf::~filebuf(local_a90);
    std::ios_base::~ios_base(aiStack_9a0);
    std::__cxx11::ostringstream::~ostringstream(local_498);
    std::ios_base::~ios_base(local_428);
    local_898 = pcVar1;
    *(undefined8 *)(local_890 + *(long *)(pcVar1 + -0x18) + -8) = uVar4;
    std::filebuf::~filebuf(local_890);
    std::ios_base::~ios_base(aiStack_7a0);
    std::__cxx11::ostringstream::~ostringstream(local_320);
    std::ios_base::~ios_base(local_2b0);
    local_698 = pcVar1;
  }
  *(undefined8 *)(local_690 + *(long *)(local_698 + -0x18) + -8) = uVar4;
  std::filebuf::~filebuf(local_690);
  std::ios_base::~ios_base(local_5a0);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void singleParticleSpectra::output_three_particle_correlation() {
    ostringstream filename;
    if (rap_type == 0) {
        filename << path_ << "/particle_" << particle_monval << "_Cmnk"
                 << "_eta_" << rap_min << "_" << rap_max << ".dat";
    } else {
        filename << path_ << "/particle_" << particle_monval << "_Cmnk"
                 << "_y_" << rap_min << "_" << rap_max << ".dat";
    }
    ofstream output(filename.str().c_str());
    output << "# n  C_nmk  C_nmk_err" << endl;

    double num_pair = C_nmk[0] / total_number_of_events;
    double num_pair_stdsq =
        (C_nmk_err[0] / total_number_of_events - num_pair * num_pair);
    double num_pair_err = 0.0;
    if (num_pair_stdsq > 0) {
        num_pair_err = sqrt(num_pair_stdsq / total_number_of_events);
    }
    output << scientific << setw(18) << setprecision(8) << 0 << "  " << num_pair
           << "  " << num_pair_err << endl;
    for (int i = 1; i < num_corr; i++) {
        double Cnmk_avg = C_nmk[i] / total_number_of_events;
        double Cnmk_stdsq =
            (C_nmk_err[i] / total_number_of_events - Cnmk_avg * Cnmk_avg);
        Cnmk_avg = Cnmk_avg / num_pair;
        double Cnmk_err = 0.0;
        if (Cnmk_stdsq > 0) {
            Cnmk_err = sqrt(Cnmk_stdsq / total_number_of_events);
            Cnmk_err = Cnmk_err / num_pair;
        }
        output << scientific << setw(18) << setprecision(8) << i << "  "
               << Cnmk_avg << "  " << Cnmk_err << endl;
    }
    if (flag_charge_dependence == 1) {
        ostringstream filename_ss;
        if (rap_type == 0) {
            filename_ss << path_ << "/particle_" << particle_monval
                        << "_Cmnk_ss_eta_" << rap_min << "_" << rap_max
                        << ".dat";
        } else {
            filename_ss << path_ << "/particle_" << particle_monval
                        << "_Cmnk_ss_y_" << rap_min << "_" << rap_max << ".dat";
        }
        ofstream output_ss(filename_ss.str().c_str());
        output_ss << "# n  C_nmk_ss  C_nmk_ss_err  C_nmk_ss_13  C_nmk_ss_13_err"
                  << endl;

        double num_pair_ss = C_nmk_ss[0] / total_number_of_events;
        double num_pair_ss_stdsq =
            (C_nmk_ss_err[0] / total_number_of_events
             - num_pair_ss * num_pair_ss);
        double num_pair_ss_err = 0.0;
        if (num_pair_ss_stdsq > 0) {
            num_pair_ss_err = sqrt(num_pair_ss_stdsq / total_number_of_events);
        }
        double num_pair_ss_13 = C_nmk_ss_13[0] / total_number_of_events;
        double num_pair_ss_13_stdsq =
            (C_nmk_ss_13_err[0] / total_number_of_events
             - num_pair_ss_13 * num_pair_ss_13);
        double num_pair_ss_13_err = 0.0;
        if (num_pair_ss_13_stdsq > 0) {
            num_pair_ss_13_err =
                sqrt(num_pair_ss_13_stdsq / total_number_of_events);
        }
        output_ss << scientific << setw(18) << setprecision(8) << 0 << "  "
                  << num_pair_ss << "  " << num_pair_ss_err << "  "
                  << num_pair_ss_13 << "  " << num_pair_ss_13_err << endl;
        for (int i = 1; i < num_corr; i++) {
            double Cnmk_ss_avg = C_nmk_ss[i] / total_number_of_events;
            double Cnmk_ss_stdsq =
                (C_nmk_ss_err[i] / total_number_of_events
                 - Cnmk_ss_avg * Cnmk_ss_avg);
            Cnmk_ss_avg = Cnmk_ss_avg / num_pair_ss;
            double Cnmk_ss_err = 0.0;
            if (Cnmk_ss_stdsq > 0) {
                Cnmk_ss_err = sqrt(Cnmk_ss_stdsq / total_number_of_events);
                Cnmk_ss_err = Cnmk_ss_err / num_pair_ss;
            }
            double Cnmk_ss_13_avg = C_nmk_ss_13[i] / total_number_of_events;
            double Cnmk_ss_13_stdsq =
                (C_nmk_ss_13_err[i] / total_number_of_events
                 - Cnmk_ss_13_avg * Cnmk_ss_13_avg);
            Cnmk_ss_13_avg = Cnmk_ss_13_avg / num_pair_ss_13;
            double Cnmk_ss_13_err = 0.0;
            if (Cnmk_ss_13_stdsq > 0) {
                Cnmk_ss_13_err =
                    sqrt(Cnmk_ss_13_stdsq / total_number_of_events);
                Cnmk_ss_13_err = Cnmk_ss_13_err / num_pair_ss_13;
            }
            output_ss << scientific << setw(18) << setprecision(8) << i << "  "
                      << Cnmk_ss_avg << "  " << Cnmk_ss_err << "  "
                      << Cnmk_ss_13_avg << "  " << Cnmk_ss_13_err << endl;
        }
        ostringstream filename_os;
        if (rap_type == 0) {
            filename_os << path_ << "/particle_" << particle_monval
                        << "_Cmnk_os_eta_" << rap_min << "_" << rap_max
                        << ".dat";
        } else {
            filename_os << path_ << "/particle_" << particle_monval
                        << "_Cmnk_os_y_" << rap_min << "_" << rap_max << ".dat";
        }
        ofstream output_os(filename_os.str().c_str());
        output_os << "# n  C_nmk_os  C_nmk_os_err  C_nmk_os_13  C_nmk_os_13_err"
                  << endl;

        double num_pair_os = C_nmk_os[0] / total_number_of_events;
        double num_pair_os_stdsq =
            (C_nmk_os_err[0] / total_number_of_events
             - num_pair_os * num_pair_os);
        double num_pair_os_err = 0.0;
        if (num_pair_os_stdsq > 0) {
            num_pair_os_err = sqrt(num_pair_os_stdsq / total_number_of_events);
        }
        double num_pair_os_13 = C_nmk_os_13[0] / total_number_of_events;
        double num_pair_os_13_stdsq =
            (C_nmk_os_13_err[0] / total_number_of_events
             - num_pair_os_13 * num_pair_os_13);
        double num_pair_os_13_err = 0.0;
        if (num_pair_os_13_stdsq > 0) {
            num_pair_os_13_err =
                sqrt(num_pair_os_13_stdsq / total_number_of_events);
        }
        output_os << scientific << setw(18) << setprecision(8) << 0 << "  "
                  << num_pair_os << "  " << num_pair_os_err << "  "
                  << num_pair_os_13 << "  " << num_pair_os_13_err << endl;
        for (int i = 1; i < num_corr; i++) {
            double Cnmk_os_avg = C_nmk_os[i] / total_number_of_events;
            double Cnmk_os_stdsq =
                (C_nmk_os_err[i] / total_number_of_events
                 - Cnmk_os_avg * Cnmk_os_avg);
            Cnmk_os_avg = Cnmk_os_avg / num_pair_os;
            double Cnmk_os_err = 0.0;
            if (Cnmk_os_stdsq > 0) {
                Cnmk_os_err = sqrt(Cnmk_os_stdsq / total_number_of_events);
                Cnmk_os_err = Cnmk_os_err / num_pair_os;
            }
            double Cnmk_os_13_avg = C_nmk_os_13[i] / total_number_of_events;
            double Cnmk_os_13_stdsq =
                (C_nmk_os_13_err[i] / total_number_of_events
                 - Cnmk_os_13_avg * Cnmk_os_13_avg);
            Cnmk_os_13_avg = Cnmk_os_13_avg / num_pair_os_13;
            double Cnmk_os_13_err = 0.0;
            if (Cnmk_os_13_stdsq > 0) {
                Cnmk_os_13_err =
                    sqrt(Cnmk_os_13_stdsq / total_number_of_events);
                Cnmk_os_13_err = Cnmk_os_13_err / num_pair_os_13;
            }
            output_os << scientific << setw(18) << setprecision(8) << i << "  "
                      << Cnmk_os_avg << "  " << Cnmk_os_err << "  "
                      << Cnmk_os_13_avg << "  " << Cnmk_os_13_err << endl;
        }
    }
}